

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.cpp
# Opt level: O2

Token * __thiscall
OpenMD::SelectionCompiler::tokenNext(Token *__return_storage_ptr__,SelectionCompiler *this)

{
  size_t sVar1;
  pointer pTVar2;
  
  sVar1 = this->itokenInfix;
  pTVar2 = (this->atokenInfix).super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (sVar1 == ((long)(this->atokenInfix).
                      super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pTVar2) / 0x18) {
    __return_storage_ptr__->tok = 5;
    *(undefined8 *)&__return_storage_ptr__->intValue = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->value)._M_manager + 4) = 0;
    *(undefined4 *)((long)&(__return_storage_ptr__->value)._M_storage + 4) = 0;
  }
  else {
    this->itokenInfix = sVar1 + 1;
    Token::Token(__return_storage_ptr__,pTVar2 + sVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

Token SelectionCompiler::tokenNext() {
    if (itokenInfix == atokenInfix.size()) { return Token(); }
    return atokenInfix[itokenInfix++];
  }